

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5Bm25Function(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                     sqlite3_value **apVal)

{
  u64 n;
  double dVar1;
  void *__s;
  double dVar2;
  int errCode;
  uint uVar3;
  uint *__s_00;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined4 uVar7;
  undefined4 uVar8;
  int nInst;
  int io;
  sqlite3_int64 nToken;
  sqlite3_int64 nRow;
  int local_54;
  long local_50;
  sqlite3_int64 local_48;
  sqlite3_int64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = 0;
  __s_00 = (uint *)(*pApi->xGetAuxdata)(pFts,0);
  if (__s_00 == (uint *)0x0) {
    __s_00 = (uint *)0x0;
    local_40 = 0;
    local_48 = 0;
    uVar3 = (*pApi->xPhraseCount)(pFts);
    iVar6 = sqlite3_initialize();
    errCode = 7;
    if (iVar6 == 0) {
      n = (long)(int)(uVar3 * 2) * 8 + 0x20;
      __s_00 = (uint *)sqlite3Malloc(n);
      if (__s_00 == (uint *)0x0) {
        __s_00 = (uint *)0x0;
      }
      else {
        memset(__s_00,0,n);
        *__s_00 = uVar3;
        *(uint **)(__s_00 + 4) = __s_00 + 8;
        *(uint **)(__s_00 + 6) = __s_00 + (long)(int)uVar3 * 2 + 8;
        errCode = (*pApi->xRowCount)(pFts,&local_40);
        if ((errCode == 0) && (errCode = (*pApi->xColumnTotalSize)(pFts,-1,&local_48), errCode == 0)
           ) {
          *(double *)(__s_00 + 2) = (double)local_48 / (double)local_40;
          if (0 < (int)uVar3) {
            uVar5 = 0;
            do {
              local_50 = 0;
              errCode = (*pApi->xQueryPhrase)(pFts,(int)uVar5,&local_50,fts5CountCb);
              if (errCode != 0) goto LAB_001f0e31;
              dVar2 = log(((double)(local_40 - local_50) + 0.5) / ((double)local_50 + 0.5));
              *(ulong *)(*(long *)(__s_00 + 4) + uVar5 * 8) =
                   ~-(ulong)(0.0 < dVar2) & 0x3eb0c6f7a0b5ed8d |
                   (ulong)dVar2 & -(ulong)(0.0 < dVar2);
              uVar5 = uVar5 + 1;
            } while (uVar3 != uVar5);
          }
          errCode = (*pApi->xSetAuxdata)(pFts,__s_00,sqlite3_free);
          if (errCode == 0) goto LAB_001f0c2a;
          goto LAB_001f0e39;
        }
      }
    }
LAB_001f0e31:
    sqlite3_free(__s_00);
  }
  else {
LAB_001f0c2a:
    __s = *(void **)(__s_00 + 6);
    memset(__s,0,(long)(int)*__s_00 << 3);
    errCode = (*pApi->xInstCount)(pFts,&local_54);
    if ((errCode == 0) && (0 < local_54)) {
      iVar6 = 0;
      do {
        local_40 = CONCAT44(local_40._4_4_,0xaaaaaaaa);
        local_48 = CONCAT44(local_48._4_4_,0xaaaaaaaa);
        local_50 = CONCAT44(local_50._4_4_,0xaaaaaaaa);
        errCode = (*pApi->xInst)(pFts,iVar6,(int *)&local_40,(int *)&local_48,(int *)&local_50);
        if (errCode != 0) goto LAB_001f0e39;
        uVar7 = 0;
        uVar8 = 0x3ff00000;
        if ((int)local_48 < nVal) {
          dVar2 = sqlite3VdbeRealValue(apVal[(int)local_48]);
          uVar7 = SUB84(dVar2,0);
          uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        *(double *)((long)__s + (long)(int)local_40 * 8) =
             (double)CONCAT44(uVar8,uVar7) + *(double *)((long)__s + (long)(int)local_40 * 8);
        iVar6 = iVar6 + 1;
      } while (iVar6 < local_54);
    }
    else if (errCode != 0) goto LAB_001f0e39;
    local_40 = CONCAT44(local_40._4_4_,0xaaaaaaaa);
    errCode = (*pApi->xColumnSize)(pFts,-1,(int *)&local_40);
    if (errCode == 0) {
      if ((long)(int)*__s_00 < 1) {
        dVar2 = 0.0;
      }
      else {
        dVar2 = 0.0;
        lVar4 = 0;
        do {
          dVar1 = *(double *)((long)__s + lVar4 * 8);
          dVar2 = dVar2 + ((dVar1 * 2.2) /
                          (dVar1 + (((double)(int)local_40 * 0.75) / *(double *)(__s_00 + 2) + 0.25)
                                   * 1.2)) * *(double *)(*(long *)(__s_00 + 4) + lVar4 * 8);
          lVar4 = lVar4 + 1;
        } while ((int)*__s_00 != lVar4);
      }
      sqlite3VdbeMemSetDouble(pCtx->pOut,-dVar2);
      goto LAB_001f0e44;
    }
  }
LAB_001f0e39:
  sqlite3_result_error_code(pCtx,errCode);
LAB_001f0e44:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5Bm25Function(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  const double k1 = 1.2;          /* Constant "k1" from BM25 formula */
  const double b = 0.75;          /* Constant "b" from BM25 formula */
  int rc;                         /* Error code */
  double score = 0.0;             /* SQL function return value */
  Fts5Bm25Data *pData;            /* Values allocated/calculated once only */
  int i;                          /* Iterator variable */
  int nInst = 0;                  /* Value returned by xInstCount() */
  double D = 0.0;                 /* Total number of tokens in row */
  double *aFreq = 0;              /* Array of phrase freq. for current row */

  /* Calculate the phrase frequency (symbol "f(qi,D)" in the documentation)
  ** for each phrase in the query for the current row. */
  rc = fts5Bm25GetData(pApi, pFts, &pData);
  if( rc==SQLITE_OK ){
    aFreq = pData->aFreq;
    memset(aFreq, 0, sizeof(double) * pData->nPhrase);
    rc = pApi->xInstCount(pFts, &nInst);
  }
  for(i=0; rc==SQLITE_OK && i<nInst; i++){
    int ip; int ic; int io;
    rc = pApi->xInst(pFts, i, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      double w = (nVal > ic) ? sqlite3_value_double(apVal[ic]) : 1.0;
      aFreq[ip] += w;
    }
  }

  /* Figure out the total size of the current row in tokens. */
  if( rc==SQLITE_OK ){
    int nTok;
    rc = pApi->xColumnSize(pFts, -1, &nTok);
    D = (double)nTok;
  }

  /* Determine and return the BM25 score for the current row. Or, if an
  ** error has occurred, throw an exception. */
  if( rc==SQLITE_OK ){
    for(i=0; i<pData->nPhrase; i++){
      score += pData->aIDF[i] * (
          ( aFreq[i] * (k1 + 1.0) ) /
          ( aFreq[i] + k1 * (1 - b + b * D / pData->avgdl) )
      );
    }
    sqlite3_result_double(pCtx, -1.0 * score);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
}